

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * cfd::core::CryptoUtil::DecodeBase64(ByteData *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  byte local_cc;
  byte local_cb;
  value_type local_ca [2];
  long local_c8;
  size_type s4;
  size_type s3_1;
  size_type s2_2;
  size_type s1_2;
  long local_a0;
  size_type s3;
  size_type s2_1;
  size_type s1_1;
  long local_80;
  size_type s2;
  size_type s1;
  ulong local_68;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> cdst;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  string *str_local;
  ByteData *byteData;
  
  dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  uVar1 = ::std::__cxx11::string::size();
  if ((uVar1 & 3) == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    for (local_68 = 0; uVar1 = local_68, uVar2 = ::std::__cxx11::string::size(), uVar1 < uVar2;
        local_68 = local_68 + 4) {
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pcVar3 == '=') {
        s1._7_1_ = 0;
        ByteData::ByteData(__return_storage_ptr__,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        s1._7_1_ = 1;
        goto LAB_00511c61;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pcVar3 == '=') {
        s1._6_1_ = 0;
        ByteData::ByteData(__return_storage_ptr__,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        s1._6_1_ = 1;
        goto LAB_00511c61;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pcVar3 == '=') {
        pcVar3 = (char *)::std::__cxx11::string::operator[]
                                   ((ulong)dst.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        s2 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
        pcVar3 = (char *)::std::__cxx11::string::operator[]
                                   ((ulong)dst.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_80 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
        if ((s2 == 0xffffffffffffffff) || (local_80 == -1)) {
          s1_1._7_1_ = 0;
          ByteData::ByteData(__return_storage_ptr__,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
          s1_1._7_1_ = 1;
          goto LAB_00511c61;
        }
        s1_1._6_1_ = (char)(((uint)local_80 & 0x30) >> 4) + (char)s2 * '\x04';
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                   (value_type *)((long)&s1_1 + 6));
        break;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*pcVar3 == '=') {
        pcVar3 = (char *)::std::__cxx11::string::operator[]
                                   ((ulong)dst.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        s2_1 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
        pcVar3 = (char *)::std::__cxx11::string::operator[]
                                   ((ulong)dst.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        s3 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
        pcVar3 = (char *)::std::__cxx11::string::operator[]
                                   ((ulong)dst.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_a0 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
        if (((s2_1 == 0xffffffffffffffff) || (s3 == 0xffffffffffffffff)) || (local_a0 == -1)) {
          s1_2._7_1_ = 0;
          ByteData::ByteData(__return_storage_ptr__,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
          s1_2._7_1_ = 1;
          goto LAB_00511c61;
        }
        s1_2._6_1_ = (char)(((uint)s3 & 0x30) >> 4) + (char)s2_1 * '\x04';
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                   (value_type *)((long)&s1_2 + 6));
        s1_2._5_1_ = (byte)((uint)s3 << 4) | (byte)(((uint)local_a0 & 0x3c) >> 2);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                   (value_type *)((long)&s1_2 + 5));
        break;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      s2_2 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      s3_1 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      s4 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
      pcVar3 = (char *)::std::__cxx11::string::operator[]
                                 ((ulong)dst.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_c8 = ::std::__cxx11::string::find(-0x80,(ulong)(uint)(int)*pcVar3);
      if (((s2_2 == 0xffffffffffffffff) || (s3_1 == 0xffffffffffffffff)) ||
         ((s4 == 0xffffffffffffffff || (local_c8 == -1)))) {
        local_ca[1] = 0;
        ByteData::ByteData(__return_storage_ptr__,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
        local_ca[1] = 1;
        goto LAB_00511c61;
      }
      local_ca[0] = (char)(((uint)s3_1 & 0x30) >> 4) + (char)s2_2 * '\x04';
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,local_ca);
      local_cb = (byte)((uint)s3_1 << 4) | (byte)(((uint)s4 & 0x3c) >> 2);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,&local_cb);
      local_cc = (byte)((uint)s4 << 6) | (byte)local_c8 & 0x3f;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,&local_cc);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
LAB_00511c61:
    cdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  }
  else {
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    cdst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase64(const std::string &str) {
  std::vector<uint8_t> dst;
  if (str.size() & 0x00000003) {
    ByteData byteData(dst);
    return byteData;
  }

  std::vector<uint8_t> cdst;
  for (std::size_t i = 0; i < str.size(); i += 4) {
    if (str[i + 0] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 1] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 2] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);

      if (s1 == std::string::npos || s2 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));

      break;
    } else if (str[i + 3] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));

      break;
    } else {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);
      const std::string::size_type s4 = kBase64EncodeTable.find(str[i + 3]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos || s4 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));
      cdst.push_back(
          static_cast<uint8_t>(((s3 & 0x03) << 6) | ((s4 & 0x3F) >> 0)));
    }
  }
  dst.swap(cdst);
  ByteData byteData(dst);
  return byteData;
}